

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxx_gtest_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  UnitTest *this;
  TestEventListeners *this_00;
  TestEventListener *pTVar3;
  MpiTestEventListener *this_01;
  TestEventListener *default_listener;
  TestEventListeners *listeners;
  undefined1 local_48 [8];
  comm c;
  env e;
  char **ppcStack_18;
  int result;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  testing::InitGoogleTest((int *)&argv_local,argv);
  mxx::env::env((env *)&c.do_free,(int *)&argv_local,&stack0xffffffffffffffe8);
  mxx::comm::comm((comm *)local_48);
  iVar1 = mxx::comm::rank((comm *)local_48);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Running GTEST with MPI using ");
    iVar1 = mxx::comm::size((comm *)local_48);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2," processes.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::listeners(this);
  pTVar3 = testing::TestEventListeners::default_result_printer(this_00);
  pTVar3 = testing::TestEventListeners::Release(this_00,pTVar3);
  this_01 = (MpiTestEventListener *)operator_new(0x18);
  iVar1 = mxx::comm::rank((comm *)local_48);
  mxx_gtest::MpiTestEventListener::MpiTestEventListener(this_01,iVar1,pTVar3);
  testing::TestEventListeners::Append(this_00,(TestEventListener *)this_01);
  e._vptr_env._4_4_ = RUN_ALL_TESTS();
  iVar1 = mxx::comm::rank((comm *)local_48);
  if (iVar1 != 0) {
    e._vptr_env._4_4_ = 0;
  }
  argv_local._4_4_ = e._vptr_env._4_4_;
  mxx::comm::~comm((comm *)local_48);
  mxx::env::~env((env *)&c.do_free);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
    int result = 0;

    ::testing::InitGoogleTest(&argc, argv);

    mxx::env e(argc, argv);
    mxx::comm c = mxx::comm();
    //MPI_Init(&argc, &argv);

    if (c.rank() == 0)
      std::cout << "Running GTEST with MPI using " << c.size() << " processes." << std::endl;

    // set up wrapped test listener
    ::testing::TestEventListeners& listeners = ::testing::UnitTest::GetInstance()->listeners();
    ::testing::TestEventListener* default_listener =  listeners.Release(listeners.default_result_printer());
    listeners.Append(new mxx_gtest::MpiTestEventListener(c.rank(), default_listener));

    // running tests
    result = RUN_ALL_TESTS();
    if (c.rank() != 0)
      result = 0;

    // clean up MPI
    //MPI_Finalize();

    // return good status no matter what
    return result;
}